

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_add_inplace(m256v *A,m256v *B_inout)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  long lVar4;
  int iVar5;
  uint8_t *puVar6;
  long lVar7;
  
  iVar5 = B_inout->n_row;
  if (0 < iVar5) {
    lVar4 = 0;
    do {
      puVar6 = A->e + A->rstride * lVar4;
      iVar1 = A->n_col;
      if (puVar6 < puVar6 + iVar1) {
        sVar2 = B_inout->rstride;
        puVar3 = B_inout->e;
        lVar7 = 0;
        do {
          puVar3[lVar7 + sVar2 * lVar4] = puVar3[lVar7 + sVar2 * lVar4] ^ puVar6[lVar7];
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
        iVar5 = B_inout->n_row;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar5);
  }
  return;
}

Assistant:

void MV_GEN_N(_add_inplace)(const MV_GEN_TYPE* A, MV_GEN_TYPE* B_inout)
{
	assert(A->n_row == B_inout->n_row);
	assert(A->n_col == B_inout->n_col);

	for (int r = 0; r < B_inout->n_row; ++r) {
		MV_GEN_N(_multadd_row)(A, r, 1, B_inout, r);
	}
}